

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type word)

{
  qsbr_epoch other;
  bool bVar1;
  qsbr_thread_count_type qVar2;
  qsbr_thread_count_type qVar3;
  qsbr_epoch local_42;
  qsbr_epoch local_41;
  ulong local_40;
  type result;
  ulong uStack_30;
  qsbr_thread_count_type new_threads_in_previous;
  type new_word_with_thread_count;
  qsbr_thread_count_type new_thread_count;
  type new_word_with_epoch;
  type tStack_10;
  qsbr_thread_count_type old_thread_count;
  type word_local;
  
  tStack_10 = word;
  assert_invariants(word);
  new_word_with_epoch._4_4_ = get_thread_count(tStack_10);
  if (new_word_with_epoch._4_4_ == 0) {
    __assert_fail("old_thread_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x170,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  qVar2 = get_threads_in_previous_epoch(tStack_10);
  if (qVar2 != 1) {
    __assert_fail("get_threads_in_previous_epoch(word) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x171,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  new_word_with_thread_count._6_1_ = get_epoch(tStack_10);
  new_word_with_thread_count._7_1_ =
       detail::qsbr_epoch::advance((qsbr_epoch *)((long)&new_word_with_thread_count + 6),1);
  _new_thread_count = make_from_epoch(new_word_with_thread_count._7_1_);
  result._4_4_ = new_word_with_epoch._4_4_ - 1;
  uStack_30 = (ulong)result._4_4_ << 0x20;
  local_40 = _new_thread_count | uStack_30 | (ulong)result._4_4_;
  new_word_with_thread_count._0_4_ = result._4_4_;
  local_42 = get_epoch(tStack_10);
  local_41 = detail::qsbr_epoch::advance(&local_42,1);
  other = get_epoch(local_40);
  bVar1 = detail::qsbr_epoch::operator==(&local_41,other);
  if (!bVar1) {
    __assert_fail("get_epoch(word).advance() == get_epoch(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x17b,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  qVar2 = get_thread_count(tStack_10);
  qVar3 = get_thread_count(local_40);
  if (qVar2 - 1 == qVar3) {
    qVar2 = get_threads_in_previous_epoch(local_40);
    qVar3 = get_thread_count(local_40);
    if (qVar2 == qVar3) {
      assert_invariants(local_40);
      return local_40;
    }
    __assert_fail("get_threads_in_previous_epoch(result) == get_thread_count(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x17e,
                  "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
  }
  __assert_fail("get_thread_count(word) - 1 == get_thread_count(result)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x17c,
                "static type unodb::qsbr_state::inc_epoch_dec_thread_count_reset_previous(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type
  inc_epoch_dec_thread_count_reset_previous(type word) noexcept {
    assert_invariants(word);
    const auto old_thread_count = get_thread_count(word);
    UNODB_DETAIL_ASSERT(old_thread_count > 0);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) == 1);

    const auto new_word_with_epoch = make_from_epoch(get_epoch(word).advance());
    const auto new_thread_count = old_thread_count - 1;
    const auto new_word_with_thread_count = static_cast<type>(new_thread_count)
                                            << thread_count_in_word_offset;
    const auto new_threads_in_previous = new_thread_count;
    const auto result = new_word_with_epoch | new_word_with_thread_count |
                        new_threads_in_previous;

    UNODB_DETAIL_ASSERT(get_epoch(word).advance() == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) - 1 == get_thread_count(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(result) ==
                        get_thread_count(result));
    assert_invariants(result);

    return result;
  }